

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O2

int run_test_fs_event_close_in_callback(void)

{
  int iVar1;
  uv_loop_t *loop;
  undefined8 uVar2;
  char *pcVar3;
  char *pcVar4;
  int64_t eval_b;
  int64_t eval_a;
  
  loop = uv_default_loop();
  fs_event_unlink_files((uv_timer_t *)0x0);
  create_dir("watch_dir");
  iVar1 = uv_fs_event_init(loop,&fs_event);
  eval_a = (int64_t)iVar1;
  eval_b = 0;
  if (eval_a == 0) {
    iVar1 = uv_fs_event_start(&fs_event,fs_event_cb_close,"watch_dir",0);
    eval_a = (int64_t)iVar1;
    eval_b = 0;
    if (eval_a == 0) {
      iVar1 = uv_timer_init(loop,&timer);
      eval_a = (int64_t)iVar1;
      eval_b = 0;
      if (eval_a == 0) {
        iVar1 = uv_timer_start(&timer,fs_event_create_files,100,0);
        eval_a = (int64_t)iVar1;
        eval_b = 0;
        if (eval_a == 0) {
          uv_run(loop,UV_RUN_DEFAULT);
          uv_close((uv_handle_t *)&timer,close_cb);
          uv_run(loop,UV_RUN_ONCE);
          eval_a = 2;
          eval_b = (int64_t)close_cb_called;
          if (eval_b == 2) {
            eval_a = 3;
            eval_b = (int64_t)fs_event_cb_called;
            if (eval_b == 3) {
              fs_event_unlink_files((uv_timer_t *)0x0);
              remove("watch_dir/");
              close_loop(loop);
              eval_a = 0;
              iVar1 = uv_loop_close(loop);
              eval_b = (int64_t)iVar1;
              if (eval_b == 0) {
                uv_library_shutdown();
                return 0;
              }
              pcVar4 = "uv_loop_close(loop)";
              pcVar3 = "0";
              uVar2 = 0x3dd;
            }
            else {
              pcVar4 = "fs_event_cb_called";
              pcVar3 = "3";
              uVar2 = 0x3d7;
            }
          }
          else {
            pcVar4 = "close_cb_called";
            pcVar3 = "2";
            uVar2 = 0x3d6;
          }
        }
        else {
          pcVar4 = "0";
          pcVar3 = "r";
          uVar2 = 0x3ce;
        }
      }
      else {
        pcVar4 = "0";
        pcVar3 = "r";
        uVar2 = 0x3cc;
      }
    }
    else {
      pcVar4 = "0";
      pcVar3 = "r";
      uVar2 = 0x3c9;
    }
  }
  else {
    pcVar4 = "0";
    pcVar3 = "r";
    uVar2 = 0x3c7;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-event.c"
          ,uVar2,pcVar3,"==",pcVar4,eval_a,"==",eval_b);
  abort();
}

Assistant:

TEST_IMPL(fs_event_close_in_callback) {
#if defined(NO_FS_EVENTS)
  RETURN_SKIP(NO_FS_EVENTS);
#elif defined(__MVS__)
  RETURN_SKIP("Directory watching not supported on this platform.");
#elif defined(__APPLE__) && defined(__TSAN__)
  RETURN_SKIP("Times out under TSAN.");
#endif
  uv_loop_t* loop;
  int r;

  loop = uv_default_loop();

  fs_event_unlink_files(NULL);
  create_dir("watch_dir");

  r = uv_fs_event_init(loop, &fs_event);
  ASSERT_OK(r);
  r = uv_fs_event_start(&fs_event, fs_event_cb_close, "watch_dir", 0);
  ASSERT_OK(r);

  r = uv_timer_init(loop, &timer);
  ASSERT_OK(r);
  r = uv_timer_start(&timer, fs_event_create_files, 100, 0);
  ASSERT_OK(r);

  uv_run(loop, UV_RUN_DEFAULT);

  uv_close((uv_handle_t*)&timer, close_cb);

  uv_run(loop, UV_RUN_ONCE);

  ASSERT_EQ(2, close_cb_called);
  ASSERT_EQ(3, fs_event_cb_called);

  /* Clean up */
  fs_event_unlink_files(NULL);
  remove("watch_dir/");

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}